

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_pretailcall(lua_State *L,CallInfo *ci,StkId func,int narg1,int delta)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  StkId pSVar4;
  long lVar5;
  byte bVar6;
  uint status;
  int nres;
  CallInfo *ci_00;
  long lVar7;
  ulong uVar8;
  lua_CFunction p_Var9;
  ulong uVar10;
  undefined1 *puVar11;
  
  uVar8 = (ulong)narg1;
  uVar10 = uVar8 << 4 | 8;
  status = 0;
  while( true ) {
    bVar6 = (func->val).tt_ & 0x3f;
    if (bVar6 == 6) {
      lVar3 = *(long *)((func->val).value_.f + 0x18);
      bVar6 = *(byte *)(lVar3 + 0xc);
      bVar2 = *(byte *)(lVar3 + 10);
      lVar7 = (ulong)bVar6 - (long)delta;
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= lVar7) {
        lVar5 = (L->stack).offset;
        luaD_growstack(L,(int)lVar7,1);
        func = (StkId)(((long)func - lVar5) + (long)(L->stack).p);
      }
      (ci->func).p = (ci->func).p + -(long)delta;
      if (0 < (int)uVar8) {
        lVar7 = 0;
        do {
          pSVar4 = (ci->func).p;
          *(undefined8 *)((long)pSVar4 + lVar7) = *(undefined8 *)((long)func + lVar7);
          *(undefined1 *)((long)pSVar4 + lVar7 + 8) = *(undefined1 *)((long)func + lVar7 + 8);
          lVar7 = lVar7 + 0x10;
        } while ((uVar8 & 0xffffffff) << 4 != lVar7);
      }
      pSVar4 = (ci->func).p;
      if ((int)uVar8 <= (int)(uint)bVar2) {
        lVar7 = uVar8 - 1;
        puVar11 = (undefined1 *)(uVar10 + (long)pSVar4);
        do {
          *puVar11 = 0;
          lVar7 = lVar7 + 1;
          puVar11 = puVar11 + 0x10;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (lVar7 < (long)(ulong)(uint)bVar2);
      }
      (ci->top).p = pSVar4 + (ulong)bVar6 + 1;
      (ci->u).l.savedpc = *(Instruction **)(lVar3 + 0x40);
      pbVar1 = (byte *)((long)&ci->callstatus + 2);
      *pbVar1 = *pbVar1 | 0x40;
      (L->top).p = pSVar4 + (uVar8 & 0xffffffff);
      return -1;
    }
    if (bVar6 == 0x16) break;
    if (bVar6 == 0x26) {
      p_Var9 = *(lua_CFunction *)((func->val).value_.f + 0x18);
      if ((long)(L->stack_last).p - (L->top).offset < 0x150) {
        lVar3 = (L->stack).offset;
        luaD_growstack(L,0x14,1);
        func = (StkId)(((long)func - lVar3) + (long)(L->stack).p);
      }
      lVar3 = (L->top).offset;
      ci_00 = L->ci->next;
      if (ci_00 == (CallInfo *)0x0) {
        ci_00 = luaE_extendCI(L);
      }
      L->ci = ci_00;
      (ci_00->func).p = func;
      ci_00->callstatus = status | 0x8000;
      (ci_00->top).p = (StkId)(lVar3 + 0x140);
      L->ci = ci_00;
      if ((L->hookmask & 1U) != 0) {
        luaD_pretailcall_cold_2();
      }
      goto LAB_0010bbec;
    }
    if ((long)(L->stack_last).p - (L->top).offset < 0x11) {
      lVar3 = (L->stack).offset;
      luaD_growstack(L,1,1);
      func = (StkId)(((long)func - lVar3) + (long)(L->stack).p);
    }
    status = tryfuncTM(L,func,status);
    uVar8 = uVar8 + 1;
    uVar10 = uVar10 + 0x10;
  }
  p_Var9 = (func->val).value_.f;
  if ((long)(L->stack_last).p - (L->top).offset < 0x150) {
    lVar3 = (L->stack).offset;
    luaD_growstack(L,0x14,1);
    func = (StkId)(((long)func - lVar3) + (long)(L->stack).p);
  }
  lVar3 = (L->top).offset;
  ci_00 = L->ci->next;
  if (ci_00 == (CallInfo *)0x0) {
    ci_00 = luaE_extendCI(L);
  }
  L->ci = ci_00;
  (ci_00->func).p = func;
  ci_00->callstatus = status | 0x8000;
  (ci_00->top).p = (StkId)(lVar3 + 0x140);
  L->ci = ci_00;
  if ((L->hookmask & 1U) != 0) {
    luaD_pretailcall_cold_1();
  }
LAB_0010bbec:
  nres = (*p_Var9)(L);
  luaD_poscall(L,ci_00,nres);
  return nres;
}

Assistant:

int luaD_pretailcall (lua_State *L, CallInfo *ci, StkId func,
                                    int narg1, int delta) {
  unsigned status = LUA_MULTRET + 1;
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      return precallC(L, func, status, clCvalue(s2v(func))->f);
    case LUA_VLCF:  /* light C function */
      return precallC(L, func, status, fvalue(s2v(func)));
    case LUA_VLCL: {  /* Lua function */
      Proto *p = clLvalue(s2v(func))->p;
      int fsize = p->maxstacksize;  /* frame size */
      int nfixparams = p->numparams;
      int i;
      checkstackp(L, fsize - delta, func);
      ci->func.p -= delta;  /* restore 'func' (if vararg) */
      for (i = 0; i < narg1; i++)  /* move down function and arguments */
        setobjs2s(L, ci->func.p + i, func + i);
      func = ci->func.p;  /* moved-down function */
      for (; narg1 <= nfixparams; narg1++)
        setnilvalue(s2v(func + narg1));  /* complete missing arguments */
      ci->top.p = func + 1 + fsize;  /* top for new function */
      lua_assert(ci->top.p <= L->stack_last.p);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus |= CIST_TAIL;
      L->top.p = func + narg1;  /* set top */
      return -1;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* space for metamethod */
      status = tryfuncTM(L, func, status);  /* try '__call' metamethod */
      narg1++;
      goto retry;  /* try again */
    }
  }
}